

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::DictionaryFeatureType::MergePartialFromCodedStream
          (DictionaryFeatureType *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  Int64FeatureType *this_00;
  StringFeatureType *this_01;
  pair<int,_int> pVar8;
  ulong uVar9;
  CodedInputStream *pCVar10;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001e3793;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001e3793:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) {
LAB_001e386b:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    }
    else {
      uVar6 = (uint)(uVar9 >> 3) & 0x1fffffff;
      if (uVar6 == 2) {
        if ((char)uVar9 != '\x12') goto LAB_001e386b;
        if (this->_oneof_case_[0] != 2) {
          clear_KeyType(this);
          this->_oneof_case_[0] = 2;
          this_01 = (StringFeatureType *)operator_new(0x18);
          StringFeatureType::StringFeatureType(this_01);
          (this->KeyType_).stringkeytype_ = this_01;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < iVar7)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pCVar10 = input;
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar7);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar4 = StringFeatureType::MergePartialFromCodedStream((StringFeatureType *)pCVar10,input);
      }
      else {
        if ((uVar6 != 1) || ((char)uVar9 != '\n')) goto LAB_001e386b;
        if (this->_oneof_case_[0] != 1) {
          clear_KeyType(this);
          this->_oneof_case_[0] = 1;
          this_00 = (Int64FeatureType *)operator_new(0x18);
          Int64FeatureType::Int64FeatureType(this_00);
          (this->KeyType_).int64keytype_ = this_00;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < iVar7)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pCVar10 = input;
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar7);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar4 = Int64FeatureType::MergePartialFromCodedStream((Int64FeatureType *)pCVar10,input);
      }
      if (bVar4 == false) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar8.first);
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool DictionaryFeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.DictionaryFeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Int64FeatureType int64KeyType = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64keytype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringFeatureType stringKeyType = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringkeytype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.DictionaryFeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.DictionaryFeatureType)
  return false;
#undef DO_
}